

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_sse2.c
# Opt level: O0

void aom_quantize_b_sse2(tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,
                        int16_t *round_ptr,int16_t *quant_ptr,int16_t *quant_shift_ptr,
                        tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,
                        uint16_t *eob_ptr,int16_t *scan_ptr,int16_t *iscan_ptr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined8 uVar20;
  __m128i shift_00;
  __m128i shift_01;
  __m128i shift_02;
  __m128i zero_00;
  __m128i zero_01;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  int16_t iVar30;
  int16_t *in_RCX;
  __m128i *round_00;
  int16_t *in_RDX;
  longlong extraout_RDX_00;
  tran_low_t *coeff_ptr_00;
  longlong extraout_RDX_01;
  tran_low_t *coeff_ptr_01;
  longlong extraout_RDX_03;
  tran_low_t *coeff_ptr_02;
  longlong extraout_RDX_04;
  tran_low_t *coeff_ptr_03;
  long in_RSI;
  __m128i *palVar31;
  tran_low_t *in_RDI;
  tran_low_t *ptVar32;
  __m128i *palVar33;
  int16_t *in_R8;
  int16_t *in_R9;
  __m128i *quant_00;
  longlong extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  ulong extraout_XMM0_Qa_10;
  ulong extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  longlong extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  ulong extraout_XMM0_Qb_10;
  ulong extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  short sVar34;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar46;
  short sVar47;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i alVar48;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i coeff_vals;
  __m128i coeff_vals_00;
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i coeff_vals_01;
  __m128i coeff_vals_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i coeff_vals_03;
  __m128i coeff_vals_04;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i coeff_vals_05;
  __m128i coeff_vals_06;
  __m128i eob_00;
  __m128i sign;
  __m128i sign_00;
  __m128i sign_01;
  __m128i sign_02;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i zbin_mask0;
  __m128i sign_03;
  __m128i sign_04;
  __m128i sign_05;
  __m128i sign_06;
  __m128i dequant_02;
  __m128i dequant_03;
  __m128i zbin_mask0_00;
  __m128i quant_01;
  __m128i quant_02;
  __m128i quant_03;
  __m128i quant_04;
  __m128i round_01;
  __m128i round_02;
  __m128i round_03;
  __m128i round_04;
  __m128i zbin_mask1;
  __m128i zbin_mask1_00;
  long in_stack_00000008;
  long in_stack_00000010;
  int16_t *in_stack_00000018;
  __m128i eob0;
  __m128i eob;
  __m128i cmp_mask1;
  __m128i cmp_mask0;
  __m128i qcoeff1;
  __m128i qcoeff0;
  __m128i coeff1_sign;
  __m128i coeff0_sign;
  __m128i coeff1;
  __m128i coeff0;
  __m128i shift;
  __m128i dequant;
  __m128i quant;
  __m128i round;
  __m128i zbin;
  int index;
  __m128i zero;
  __m128i *dequant_04;
  __m128i *shift_03;
  undefined8 local_388;
  undefined8 uStack_380;
  __m128i local_358;
  ulong local_348;
  ulong uStack_340;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  longlong local_318 [2];
  longlong local_308;
  longlong lStack_300;
  longlong local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 uStack_2a8;
  int local_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  long local_268;
  tran_low_t *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined4 local_23c;
  undefined4 local_21c;
  longlong local_218;
  longlong lStack_210;
  undefined4 local_1fc;
  undefined4 local_1dc;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong lStack_1c0;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  longlong lStack_180;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  longlong lStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 uStack_12c;
  longlong local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_10c;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_ec;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  undefined8 local_18;
  undefined8 uStack_10;
  longlong extraout_RDX;
  longlong extraout_RDX_02;
  undefined8 uVar45;
  
  local_258 = 0;
  uStack_250 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_29c = 0x10;
  shift_03 = (__m128i *)&local_2f8;
  dequant_04 = (__m128i *)&local_2e8;
  palVar31 = (__m128i *)&local_2b8;
  round_00 = (__m128i *)&local_2c8;
  quant_00 = (__m128i *)&local_2d8;
  local_268 = in_RSI;
  local_260 = in_RDI;
  load_b_values(in_RDX,palVar31,in_RCX,round_00,in_R8,quant_00,in_stack_00000018,dequant_04,in_R9,
                shift_03);
  load_coefficients(local_260);
  ptVar32 = local_260 + 8;
  local_308 = extraout_XMM0_Qa;
  lStack_300 = extraout_XMM0_Qb;
  alVar48 = load_coefficients(ptVar32);
  sign[0] = alVar48[1];
  local_1d8 = local_308;
  lStack_1d0 = lStack_300;
  local_1dc = 0xf;
  auVar24._8_8_ = lStack_300;
  auVar24._0_8_ = local_308;
  local_328 = psraw(auVar24,ZEXT416(0xf));
  local_1fc = 0xf;
  auVar23._8_8_ = extraout_XMM0_Qb_00;
  auVar23._0_8_ = extraout_XMM0_Qa_00;
  local_338 = psraw(auVar23,ZEXT416(0xf));
  a[1] = (longlong)palVar31;
  a[0] = (longlong)ptVar32;
  sign[1] = (longlong)round_00;
  alVar48 = invert_sign_sse2(a,sign);
  sign_00[0] = alVar48[1];
  a_00[1] = (longlong)palVar31;
  a_00[0] = (longlong)ptVar32;
  sign_00[1] = (longlong)round_00;
  local_348 = extraout_XMM0_Qa_01;
  uStack_340 = extraout_XMM0_Qb_01;
  alVar48 = invert_sign_sse2(a_00,sign_00);
  round_01[1] = alVar48[1];
  local_158 = local_348;
  lVar27 = local_158;
  uStack_150 = uStack_340;
  lVar28 = uStack_150;
  lStack_160 = uStack_2b0;
  local_158._0_2_ = (short)local_348;
  local_158._2_2_ = (short)(local_348 >> 0x10);
  local_158._4_2_ = (short)(local_348 >> 0x20);
  local_158._6_2_ = (short)(local_348 >> 0x30);
  uStack_150._0_2_ = (short)uStack_340;
  uStack_150._2_2_ = (short)(uStack_340 >> 0x10);
  uStack_150._4_2_ = (short)(uStack_340 >> 0x20);
  uStack_150._6_2_ = (short)(uStack_340 >> 0x30);
  sVar34 = (short)(undefined4)local_2b8;
  bVar1 = sVar34 < (short)local_158;
  sVar42 = (short)((uint)(undefined4)local_2b8 >> 0x10);
  bVar2 = sVar42 < local_158._2_2_;
  sVar43 = (short)local_2b8._4_4_;
  bVar3 = sVar43 < local_158._4_2_;
  sVar44 = (short)((uint)local_2b8._4_4_ >> 0x10);
  bVar4 = sVar44 < local_158._6_2_;
  bVar5 = (short)uStack_2b0 < (short)uStack_150;
  bVar6 = (short)((ulong)uStack_2b0 >> 0x10) < uStack_150._2_2_;
  sVar46 = (short)((ulong)uStack_2b0 >> 0x20);
  bVar7 = sVar46 < uStack_150._4_2_;
  sVar47 = (short)((ulong)uStack_2b0 >> 0x30);
  bVar10 = sVar47 < uStack_150._6_2_;
  uStack_ac = uStack_2b0._4_4_;
  local_a8 = CONCAT44(local_a8._4_4_,uStack_2a8);
  uStack_bc = uStack_2b0._4_4_;
  auVar13._4_8_ = uStack_2b0;
  auVar13._0_4_ = local_2b8._4_4_;
  auVar35._0_8_ = auVar13._0_8_ << 0x20;
  auVar35._8_4_ = uStack_c0;
  auVar35._12_4_ = uStack_2b0._4_4_;
  uStack_2b0 = auVar35._8_8_;
  local_178 = (short)extraout_XMM0_Qa_02;
  sStack_176 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x10);
  sStack_174 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  sStack_172 = (short)((ulong)extraout_XMM0_Qa_02 >> 0x30);
  sStack_170 = (short)extraout_XMM0_Qb_02;
  sStack_16e = (short)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  sStack_16c = (short)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  sStack_16a = (short)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  auVar14._4_8_ = uStack_2b0;
  auVar14._0_4_ = uStack_2d4;
  auVar36._0_8_ = auVar14._0_8_ << 0x20;
  auVar36._8_4_ = (undefined4)uStack_2d0;
  auVar36._12_4_ = uStack_2d0._4_4_;
  uVar45 = auVar36._8_8_;
  alVar48[1]._0_4_ = (int)dequant_04;
  alVar48[0] = (longlong)in_stack_00000018;
  alVar48[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
  quant_01[1] = (longlong)in_R8;
  quant_01[0] = (longlong)round_00;
  round_01[0] = (longlong)palVar31;
  lStack_180 = uStack_2b0;
  local_158 = lVar27;
  uStack_150 = lVar28;
  calculate_qcoeff((__m128i *)&local_348,round_01,quant_01,alVar48);
  uStack_cc = uStack_2c0._4_4_;
  uStack_dc = uStack_2c0._4_4_;
  auVar15._4_8_ = uVar45;
  auVar15._0_4_ = local_2c8._4_4_;
  auVar37._0_8_ = auVar15._0_8_ << 0x20;
  auVar37._8_4_ = uStack_e0;
  auVar37._12_4_ = uStack_2c0._4_4_;
  uStack_2c0 = auVar37._8_8_;
  uStack_ec = uStack_2d0._4_4_;
  uStack_fc = uStack_2d0._4_4_;
  auVar16._4_8_ = uStack_2c0;
  auVar16._0_4_ = uStack_2d4;
  auVar38._0_8_ = auVar16._0_8_ << 0x20;
  auVar38._8_4_ = uStack_100;
  auVar38._12_4_ = uStack_2d0._4_4_;
  uStack_2d0 = auVar38._8_8_;
  uStack_10c = uStack_2f0._4_4_;
  local_128 = local_2f8;
  uStack_11c = uStack_2f0._4_4_;
  uStack_114 = (undefined4)((ulong)local_2f8 >> 0x20);
  _local_118 = CONCAT44(uStack_114,local_2e8);
  auVar17._4_8_ = uStack_2d0;
  auVar17._0_4_ = uStack_114;
  auVar39._0_8_ = auVar17._0_8_ << 0x20;
  auVar39._8_4_ = uStack_120;
  auVar39._12_4_ = uStack_2f0._4_4_;
  uStack_2f0 = auVar39._8_8_;
  palVar33 = &local_358;
  shift_00[1]._0_4_ = (int)dequant_04;
  shift_00[0] = (longlong)in_stack_00000018;
  shift_00[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
  quant_02[1] = (longlong)in_R8;
  quant_02[0] = (longlong)round_00;
  round_02[1] = extraout_RDX;
  round_02[0] = (longlong)palVar31;
  calculate_qcoeff(palVar33,round_02,quant_02,shift_00);
  a_01[1] = (longlong)palVar31;
  a_01[0] = (longlong)palVar33;
  sign_01[1] = (longlong)round_00;
  sign_01[0] = extraout_RDX_00;
  alVar48 = invert_sign_sse2(a_01,sign_01);
  sign_02[0] = alVar48[1];
  a_02[1] = (longlong)palVar31;
  a_02[0] = (longlong)palVar33;
  sign_02[1] = (longlong)round_00;
  local_348 = extraout_XMM0_Qa_03;
  uStack_340 = extraout_XMM0_Qb_03;
  alVar48 = invert_sign_sse2(a_02,sign_02);
  local_48 = CONCAT26(-(ushort)bVar4,
                      CONCAT24(-(ushort)bVar3,CONCAT22(-(ushort)bVar2,-(ushort)bVar1)));
  uStack_40 = CONCAT26(-(ushort)bVar10,
                       CONCAT24(-(ushort)bVar7,CONCAT22(-(ushort)bVar6,-(ushort)bVar5)));
  local_38 = local_348;
  uStack_30 = uStack_340;
  local_348 = local_348 & local_48;
  uStack_340 = uStack_340 & uStack_40;
  local_68 = CONCAT26(-(ushort)(sVar44 < sStack_172),
                      CONCAT24(-(ushort)(sVar43 < sStack_174),
                               CONCAT22(-(ushort)(sVar42 < sStack_176),-(ushort)(sVar34 < local_178)
                                       )));
  uStack_60 = CONCAT26(-(ushort)(sVar47 < sStack_16a),
                       CONCAT24(-(ushort)(sVar46 < sStack_16c),
                                CONCAT22(-(ushort)((short)((uint)uStack_c0 >> 0x10) < sStack_16e),
                                         -(ushort)((short)uStack_c0 < sStack_170))));
  auVar26._8_8_ = extraout_XMM0_Qb_04;
  auVar26._0_8_ = extraout_XMM0_Qa_04;
  auVar25._8_8_ = uStack_60;
  auVar25._0_8_ = local_68;
  local_358 = (__m128i)(auVar26 & auVar25);
  coeff_vals[1] = (longlong)palVar31;
  coeff_vals[0] = in_stack_00000008;
  uVar45 = uStack_60;
  store_coefficients(coeff_vals,alVar48[1]);
  coeff_vals_00[0] = in_stack_00000008 + 0x20;
  coeff_vals_00[1] = (longlong)palVar31;
  store_coefficients(coeff_vals_00,coeff_ptr_00);
  auVar18._4_8_ = uVar45;
  auVar18._0_4_ = uStack_2e4;
  auVar40._0_8_ = auVar18._0_8_ << 0x20;
  auVar40._8_4_ = (undefined4)uStack_2e0;
  auVar40._12_4_ = uStack_2e0._4_4_;
  uVar45 = auVar40._8_8_;
  qcoeff[1] = (longlong)palVar31;
  qcoeff[0] = coeff_vals_00[0];
  dequant_00[1] = (longlong)round_00;
  dequant_00[0] = extraout_RDX_01;
  alVar48 = calculate_dqcoeff(qcoeff,dequant_00);
  dequant_01[0] = alVar48[1];
  uStack_12c = uStack_2e0._4_4_;
  local_128 = CONCAT44(local_128._4_4_,local_2d8);
  uStack_13c = uStack_2e0._4_4_;
  auVar19._4_8_ = uVar45;
  auVar19._0_4_ = uStack_2e4;
  auVar41._0_8_ = auVar19._0_8_ << 0x20;
  auVar41._8_4_ = uStack_140;
  auVar41._12_4_ = uStack_2e0._4_4_;
  uStack_2e0 = auVar41._8_8_;
  qcoeff_00[1] = (longlong)palVar31;
  qcoeff_00[0] = coeff_vals_00[0];
  dequant_01[1] = (longlong)round_00;
  alVar48 = calculate_dqcoeff(qcoeff_00,dequant_01);
  coeff_vals_01[1] = (longlong)palVar31;
  coeff_vals_01[0] = in_stack_00000010;
  store_coefficients(coeff_vals_01,alVar48[1]);
  coeff_vals_02[0] = in_stack_00000010 + 0x20;
  coeff_vals_02[1] = (longlong)palVar31;
  store_coefficients(coeff_vals_02,coeff_ptr_01);
  palVar33 = (__m128i *)&local_308;
  palVar31 = &local_318;
  zero_00[1] = (longlong)shift_03;
  zero_00[0] = (longlong)in_R9;
  zbin_mask0[1] = 0;
  zbin_mask0[0] = eob[0];
  zbin_mask1[1] = (longlong)quant_00;
  zbin_mask1[0] = (longlong)in_R8;
  scan_for_eob(palVar33,palVar31,zbin_mask0,zbin_mask1,in_stack_00000018,(int)dequant_04,zero_00);
  local_388 = extraout_XMM0_Qa_05;
  uStack_380 = extraout_XMM0_Qb_05;
  for (; local_29c < local_268; local_29c = local_29c + 0x10) {
    load_coefficients(local_260 + local_29c);
    coeff_vals_00[0] = (long)local_29c;
    ptVar32 = local_260 + coeff_vals_00[0] + 8;
    local_308 = extraout_XMM0_Qa_06;
    lStack_300 = extraout_XMM0_Qb_06;
    alVar48 = load_coefficients(ptVar32);
    sign_03[0] = alVar48[1];
    local_218 = local_308;
    lStack_210 = lStack_300;
    local_21c = 0xf;
    auVar22._8_8_ = lStack_300;
    auVar22._0_8_ = local_308;
    local_328 = psraw(auVar22,ZEXT416(0xf));
    local_23c = 0xf;
    auVar21._8_8_ = extraout_XMM0_Qb_07;
    auVar21._0_8_ = extraout_XMM0_Qa_07;
    local_338 = psraw(auVar21,ZEXT416(0xf));
    a_03[1] = (longlong)palVar31;
    a_03[0] = (longlong)ptVar32;
    sign_03[1] = coeff_vals_00[0];
    alVar48 = invert_sign_sse2(a_03,sign_03);
    sign_04[0] = alVar48[1];
    a_04[1] = (longlong)palVar31;
    a_04[0] = (longlong)ptVar32;
    sign_04[1] = coeff_vals_00[0];
    local_348 = extraout_XMM0_Qa_08;
    uStack_340 = extraout_XMM0_Qb_08;
    alVar48 = invert_sign_sse2(a_04,sign_04);
    round_03[1] = alVar48[1];
    local_198 = local_348;
    lVar28 = local_198;
    uStack_190 = uStack_340;
    lVar29 = uStack_190;
    uStack_1a0 = uStack_2b0;
    lVar27 = uStack_1a0;
    local_198._0_2_ = (short)local_348;
    local_198._2_2_ = (short)(local_348 >> 0x10);
    local_198._4_2_ = (short)(local_348 >> 0x20);
    local_198._6_2_ = (short)(local_348 >> 0x30);
    uStack_190._0_2_ = (short)uStack_340;
    uStack_190._2_2_ = (short)(uStack_340 >> 0x10);
    uStack_190._4_2_ = (short)(uStack_340 >> 0x20);
    uStack_190._6_2_ = (short)(uStack_340 >> 0x30);
    local_1a8 = (short)(undefined4)local_2b8;
    sStack_1a6 = (short)((uint)(undefined4)local_2b8 >> 0x10);
    sStack_1a4 = (short)local_2b8._4_4_;
    sStack_1a2 = (short)((uint)local_2b8._4_4_ >> 0x10);
    uStack_1a0._0_2_ = (short)uStack_2b0;
    uStack_1a0._2_2_ = (short)((ulong)uStack_2b0 >> 0x10);
    uStack_1a0._4_2_ = (short)((ulong)uStack_2b0 >> 0x20);
    uStack_1a0._6_2_ = (short)((ulong)uStack_2b0 >> 0x30);
    bVar1 = local_1a8 < (short)local_198;
    bVar2 = sStack_1a6 < local_198._2_2_;
    bVar3 = sStack_1a4 < local_198._4_2_;
    bVar4 = sStack_1a2 < local_198._6_2_;
    bVar5 = (short)uStack_1a0 < (short)uStack_190;
    bVar7 = uStack_1a0._2_2_ < uStack_190._2_2_;
    bVar8 = uStack_1a0._4_2_ < uStack_190._4_2_;
    bVar11 = uStack_1a0._6_2_ < uStack_190._6_2_;
    lStack_1c0 = uStack_2b0;
    local_1b8 = (short)extraout_XMM0_Qa_09;
    sStack_1b6 = (short)((ulong)extraout_XMM0_Qa_09 >> 0x10);
    sStack_1b4 = (short)((ulong)extraout_XMM0_Qa_09 >> 0x20);
    sStack_1b2 = (short)((ulong)extraout_XMM0_Qa_09 >> 0x30);
    sStack_1b0 = (short)extraout_XMM0_Qb_09;
    sStack_1ae = (short)((ulong)extraout_XMM0_Qb_09 >> 0x10);
    sStack_1ac = (short)((ulong)extraout_XMM0_Qb_09 >> 0x20);
    sStack_1aa = (short)((ulong)extraout_XMM0_Qb_09 >> 0x30);
    bVar6 = (short)uStack_1a0 < sStack_1b0;
    bVar10 = uStack_1a0._2_2_ < sStack_1ae;
    bVar9 = uStack_1a0._4_2_ < sStack_1ac;
    bVar12 = uStack_1a0._6_2_ < sStack_1aa;
    shift_01[1]._0_4_ = (int)dequant_04;
    shift_01[0] = (longlong)in_stack_00000018;
    shift_01[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
    quant_03[1] = (longlong)in_R8;
    quant_03[0] = coeff_vals_00[0];
    round_03[0] = (longlong)palVar31;
    uStack_1a0 = lVar27;
    local_198 = lVar28;
    uStack_190 = lVar29;
    calculate_qcoeff((__m128i *)&local_348,round_03,quant_03,shift_01);
    palVar33 = &local_358;
    shift_02[1]._0_4_ = (int)dequant_04;
    shift_02[0] = (longlong)in_stack_00000018;
    shift_02[1]._4_4_ = (int)((ulong)dequant_04 >> 0x20);
    quant_04[1] = (longlong)in_R8;
    quant_04[0] = coeff_vals_00[0];
    round_04[1] = extraout_RDX_02;
    round_04[0] = (longlong)palVar31;
    calculate_qcoeff(palVar33,round_04,quant_04,shift_02);
    a_05[1] = (longlong)palVar31;
    a_05[0] = (longlong)palVar33;
    sign_05[1] = coeff_vals_00[0];
    sign_05[0] = extraout_RDX_03;
    alVar48 = invert_sign_sse2(a_05,sign_05);
    sign_06[0] = alVar48[1];
    a_06[1] = (longlong)palVar31;
    a_06[0] = (longlong)palVar33;
    sign_06[1] = coeff_vals_00[0];
    local_348 = extraout_XMM0_Qa_10;
    uStack_340 = extraout_XMM0_Qb_10;
    alVar48 = invert_sign_sse2(a_06,sign_06);
    local_88 = CONCAT26(-(ushort)bVar4,
                        CONCAT24(-(ushort)bVar3,CONCAT22(-(ushort)bVar2,-(ushort)bVar1)));
    uStack_80 = CONCAT26(-(ushort)bVar11,
                         CONCAT24(-(ushort)bVar8,CONCAT22(-(ushort)bVar7,-(ushort)bVar5)));
    local_78 = local_348;
    uStack_70 = uStack_340;
    local_348 = local_348 & local_88;
    uStack_340 = uStack_340 & uStack_80;
    local_a8 = CONCAT26(-(ushort)(sStack_1a2 < sStack_1b2),
                        CONCAT24(-(ushort)(sStack_1a4 < sStack_1b4),
                                 CONCAT22(-(ushort)(sStack_1a6 < sStack_1b6),
                                          -(ushort)(local_1a8 < local_1b8))));
    uStack_a0 = CONCAT26(-(ushort)bVar12,
                         CONCAT24(-(ushort)bVar9,CONCAT22(-(ushort)bVar10,-(ushort)bVar6)));
    local_358[1] = extraout_XMM0_Qb_11 & uStack_a0;
    local_358[0] = extraout_XMM0_Qa_11 & local_a8;
    coeff_vals_03[0] = in_stack_00000008 + (long)local_29c * 4;
    coeff_vals_03[1] = (longlong)palVar31;
    store_coefficients(coeff_vals_03,alVar48[1]);
    coeff_vals_04[0] = in_stack_00000008 + (long)local_29c * 4 + 0x20;
    coeff_vals_04[1] = (longlong)palVar31;
    store_coefficients(coeff_vals_04,coeff_ptr_02);
    qcoeff_01[1] = (longlong)palVar31;
    qcoeff_01[0] = coeff_vals_04[0];
    dequant_02[1] = coeff_vals_00[0];
    dequant_02[0] = extraout_RDX_04;
    alVar48 = calculate_dqcoeff(qcoeff_01,dequant_02);
    dequant_03[0] = alVar48[1];
    qcoeff_02[1] = (longlong)palVar31;
    qcoeff_02[0] = coeff_vals_04[0];
    dequant_03[1] = coeff_vals_00[0];
    alVar48 = calculate_dqcoeff(qcoeff_02,dequant_03);
    coeff_vals_05[0] = in_stack_00000010 + (long)local_29c * 4;
    coeff_vals_05[1] = (longlong)palVar31;
    store_coefficients(coeff_vals_05,alVar48[1]);
    coeff_vals_06[0] = in_stack_00000010 + (long)local_29c * 4 + 0x20;
    coeff_vals_06[1] = (longlong)palVar31;
    store_coefficients(coeff_vals_06,coeff_ptr_03);
    palVar33 = (__m128i *)&local_308;
    palVar31 = &local_318;
    zero_01[1] = (longlong)shift_03;
    zero_01[0] = (longlong)in_R9;
    zbin_mask0_00[1]._0_4_ = local_29c;
    zbin_mask0_00[0] = eob[0];
    zbin_mask0_00[1]._4_4_ = 0;
    zbin_mask1_00[1] = (longlong)quant_00;
    zbin_mask1_00[0] = (longlong)in_R8;
    scan_for_eob(palVar33,palVar31,zbin_mask0_00,zbin_mask1_00,in_stack_00000018,(int)dequant_04,
                 zero_01);
    uVar45 = local_388;
    uVar20 = uStack_380;
    local_18._0_2_ = (short)local_388;
    local_18._2_2_ = (short)((ulong)local_388 >> 0x10);
    local_18._4_2_ = (short)((ulong)local_388 >> 0x20);
    local_18._6_2_ = (short)((ulong)local_388 >> 0x30);
    uStack_10._0_2_ = (short)uStack_380;
    uStack_10._2_2_ = (short)((ulong)uStack_380 >> 0x10);
    uStack_10._4_2_ = (short)((ulong)uStack_380 >> 0x20);
    uStack_10._6_2_ = (short)((ulong)uStack_380 >> 0x30);
    local_28 = (short)extraout_XMM0_Qa_12;
    sStack_26 = (short)((ulong)extraout_XMM0_Qa_12 >> 0x10);
    sStack_24 = (short)((ulong)extraout_XMM0_Qa_12 >> 0x20);
    sStack_22 = (short)((ulong)extraout_XMM0_Qa_12 >> 0x30);
    sStack_20 = (short)extraout_XMM0_Qb_12;
    sStack_1e = (short)((ulong)extraout_XMM0_Qb_12 >> 0x10);
    sStack_1c = (short)((ulong)extraout_XMM0_Qb_12 >> 0x20);
    sStack_1a = (short)((ulong)extraout_XMM0_Qb_12 >> 0x30);
    local_388 = CONCAT26((ushort)(local_18._6_2_ < sStack_22) * sStack_22 |
                         (ushort)(local_18._6_2_ >= sStack_22) * local_18._6_2_,
                         CONCAT24((ushort)(local_18._4_2_ < sStack_24) * sStack_24 |
                                  (ushort)(local_18._4_2_ >= sStack_24) * local_18._4_2_,
                                  CONCAT22((ushort)(local_18._2_2_ < sStack_26) * sStack_26 |
                                           (ushort)(local_18._2_2_ >= sStack_26) * local_18._2_2_,
                                           (ushort)((short)local_18 < local_28) * local_28 |
                                           (ushort)((short)local_18 >= local_28) * (short)local_18))
                        );
    uStack_380 = CONCAT26((ushort)(uStack_10._6_2_ < sStack_1a) * sStack_1a |
                          (ushort)(uStack_10._6_2_ >= sStack_1a) * uStack_10._6_2_,
                          CONCAT24((ushort)(uStack_10._4_2_ < sStack_1c) * sStack_1c |
                                   (ushort)(uStack_10._4_2_ >= sStack_1c) * uStack_10._4_2_,
                                   CONCAT22((ushort)(uStack_10._2_2_ < sStack_1e) * sStack_1e |
                                            (ushort)(uStack_10._2_2_ >= sStack_1e) * uStack_10._2_2_
                                            ,(ushort)((short)uStack_10 < sStack_20) * sStack_20 |
                                             (ushort)((short)uStack_10 >= sStack_20) *
                                             (short)uStack_10)));
    local_18 = uVar45;
    uStack_10 = uVar20;
  }
  eob_00[1] = (longlong)palVar31;
  eob_00[0] = (longlong)palVar33;
  iVar30 = accumulate_eob(eob_00);
  *(int16_t *)eob0[0] = iVar30;
  return;
}

Assistant:

void aom_quantize_b_sse2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                         const int16_t *zbin_ptr, const int16_t *round_ptr,
                         const int16_t *quant_ptr,
                         const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
                         tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr,
                         uint16_t *eob_ptr, const int16_t *scan_ptr,
                         const int16_t *iscan_ptr) {
  const __m128i zero = _mm_setzero_si128();
  int index = 16;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i eob, eob0;

  (void)scan_ptr;

  // Setup global values.
  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  // Poor man's abs().
  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  calculate_qcoeff(&qcoeff0, round, quant, shift);

  round = _mm_unpackhi_epi64(round, round);
  quant = _mm_unpackhi_epi64(quant, quant);
  shift = _mm_unpackhi_epi64(shift, shift);

  calculate_qcoeff(&qcoeff1, round, quant, shift);

  // Reinsert signs
  qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

  // Mask out zbin threshold coeffs
  qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
  qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

  store_coefficients(qcoeff0, qcoeff_ptr);
  store_coefficients(qcoeff1, qcoeff_ptr + 8);

  coeff0 = calculate_dqcoeff(qcoeff0, dequant);
  dequant = _mm_unpackhi_epi64(dequant, dequant);
  coeff1 = calculate_dqcoeff(qcoeff1, dequant);

  store_coefficients(coeff0, dqcoeff_ptr);
  store_coefficients(coeff1, dqcoeff_ptr + 8);

  eob =
      scan_for_eob(&coeff0, &coeff1, cmp_mask0, cmp_mask1, iscan_ptr, 0, zero);

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr + index);
    store_coefficients(coeff1, dqcoeff_ptr + index + 8);

    eob0 = scan_for_eob(&coeff0, &coeff1, cmp_mask0, cmp_mask1, iscan_ptr,
                        index, zero);
    eob = _mm_max_epi16(eob, eob0);

    index += 16;
  }

  *eob_ptr = accumulate_eob(eob);
}